

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O0

bool __thiscall Rml::BaseXMLParser::FindWord(BaseXMLParser *this,String *word,char *terminators)

{
  bool bVar1;
  char x;
  byte bVar2;
  ulong uVar3;
  char *pcVar4;
  char c;
  char *terminators_local;
  String *word_local;
  BaseXMLParser *this_local;
  
  while( true ) {
    while( true ) {
      bVar1 = AtEnd(this);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return false;
      }
      x = Look(this);
      if (x == '\n') {
        this->line_number = this->line_number + 1;
      }
      bVar1 = StringUtilities::IsWhitespace(x);
      if (!bVar1) break;
      uVar3 = ::std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        return true;
      }
      Next(this);
    }
    if ((terminators != (char *)0x0) && (pcVar4 = strchr(terminators,(int)x), pcVar4 != (char *)0x0)
       ) break;
    ::std::__cxx11::string::operator+=((string *)word,x);
    Next(this);
  }
  bVar2 = ::std::__cxx11::string::empty();
  return (bool)((bVar2 ^ 0xff) & 1);
}

Assistant:

bool BaseXMLParser::FindWord(String& word, const char* terminators)
{
	while (!AtEnd())
	{
		char c = Look();

		// Count line numbers
		if (c == '\n')
		{
			line_number++;
		}

		// Ignore white space
		if (StringUtilities::IsWhitespace(c))
		{
			if (word.empty())
			{
				Next();
				continue;
			}
			else
				return true;
		}

		// Check for termination condition
		if (terminators && strchr(terminators, c))
		{
			return !word.empty();
		}

		word += c;
		Next();
	}

	return false;
}